

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QUrl>::insert
          (QMovableArrayOps<QUrl> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QUrl **ppQVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QUrl copy;
  Inserter local_60;
  QUrl local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_38,t);
  bVar3 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size != 0;
  QArrayDataPointer<QUrl>::detachAndGrow
            ((QArrayDataPointer<QUrl> *)this,(uint)(i == 0 && bVar3),n,(QUrl **)0x0,
             (QArrayDataPointer<QUrl> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      QUrl::QUrl((this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr + -1,
                 &local_38);
      ppQVar1 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_60,(QArrayDataPointer<QUrl> *)this,i,n);
    Inserter::insertFill(&local_60,&local_38,n);
    (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
  }
  QUrl::~QUrl(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }